

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_get.c
# Opt level: O0

int mpt_config_get(mpt_config *conf,char *dest,mpt_type_t type,void *ptr)

{
  int iVar1;
  undefined1 local_48 [8];
  mpt_path path;
  void *ptr_local;
  mpt_type_t type_local;
  char *dest_local;
  mpt_config *conf_local;
  
  local_48 = (undefined1  [8])0x0;
  path.base = (char *)0x0;
  path.off = 0;
  path.len = 0x2e0000;
  path._24_8_ = ptr;
  if (dest != (char *)0x0) {
    path.len = 0x2e0000;
    mpt_path_set((mpt_path *)local_48,dest,-1);
  }
  iVar1 = mpt_config_getp(conf,(mpt_path *)local_48,type,(void *)path._24_8_);
  return iVar1;
}

Assistant:

extern int mpt_config_get(const MPT_INTERFACE(config) *conf, const char *dest, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(path) path = MPT_PATH_INIT;
	if (dest) {
		path.sep = '.';
		path.assign = 0;
		mpt_path_set(&path, dest, -1);
	}
	return mpt_config_getp(conf, &path, type, ptr);
}